

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Module::removeExports(Module *this,function<bool_(wasm::Export_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::Export_*)>::function((function<bool_(wasm::Export_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>,wasm::Export>
            (&this->exports,&this->exportsMap,(function<bool_(wasm::Export_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeExports(std::function<bool(Export*)> pred) {
  removeModuleElements(exports, exportsMap, pred);
}